

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

string * wasm::String::trim(string *__return_storage_ptr__,string *input)

{
  char cVar1;
  pointer pcVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  
  pcVar2 = (input->_M_dataplus)._M_p;
  sVar4 = input->_M_string_length;
  do {
    sVar5 = sVar4 - 1;
    if (sVar4 == 0) break;
    cVar1 = pcVar2[sVar4 - 1];
    iVar3 = isspace((int)cVar1);
    sVar4 = sVar5;
  } while ((cVar1 == '\0') || (iVar3 != 0));
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)input);
  return __return_storage_ptr__;
}

Assistant:

inline std::string trim(const std::string& input) {
  size_t size = input.size();
  while (size > 0 && (isspace(input[size - 1]) || input[size - 1] == '\0')) {
    size--;
  }
  return input.substr(0, size);
}